

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall
ON_MeshComponentRef::GetBBox(ON_MeshComponentRef *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  TYPE TVar1;
  undefined1 uVar2;
  uint uVar3;
  uint i;
  uint v_count;
  uint v_capacity;
  ON_3dPoint v [16];
  uint vertex_count;
  ON_3dPointListRef vertex_list;
  bool rc;
  ON_MeshNgon *ngon;
  ON_MeshTopologyVertex *v_2;
  uint j;
  ON_MeshTopologyEdge *e;
  ON_MeshTopology *top_1;
  ON_MeshTopologyVertex *v_1;
  ON_MeshTopology *top;
  uint vdex_buffer [2];
  uint vdex_count;
  uint *vdex_list;
  bool bGrowBox_local;
  double *boxmax_local;
  double *boxmin_local;
  ON_MeshComponentRef *this_local;
  
  if ((this->m_mesh != (ON_Mesh *)0x0) &&
     (TVar1 = (this->m_mesh_ci).m_type, uVar3 = TVar1 - mesh_vertex, uVar3 < 4 || TVar1 == mesh_ngon
     )) {
    uVar2 = (*(code *)(&DAT_009fe2ac + *(int *)(&DAT_009fe2ac + (ulong)uVar3 * 4)))();
    return (bool)uVar2;
  }
  return false;
}

Assistant:

bool ON_MeshComponentRef::GetBBox(
       double* boxmin,
       double* boxmax,
       bool bGrowBox
       ) const
{
  const unsigned int* vdex_list = 0;
  unsigned int vdex_count = 0;
  unsigned int vdex_buffer[2];

  if ( 0 == m_mesh )
    return false;

  switch(m_mesh_ci.m_type)
  {
  case ON_COMPONENT_INDEX::mesh_vertex:
    if (m_mesh_ci.m_index >= 0)
      vdex_buffer[vdex_count++] = (unsigned int)m_mesh_ci.m_index;
    break;

  case ON_COMPONENT_INDEX::meshtop_vertex:
    if ( m_mesh_ci.m_index >= 0 )
    {
      const ON_MeshTopology* top = MeshTopology();
      if ( 0 != top && m_mesh_ci.m_index < top->m_topv.Count())
      {
        const ON_MeshTopologyVertex& v = top->m_topv[m_mesh_ci.m_index];
        if ( v.m_v_count > 0 && 0 != v.m_vi && v.m_vi[0] >= 0 )
          vdex_buffer[vdex_count++] = (unsigned int)v.m_vi[0];
      }
    }
    break;

  case ON_COMPONENT_INDEX::meshtop_edge:
    if ( m_mesh_ci.m_index >= 0 )
    {
      const ON_MeshTopology* top = MeshTopology();
      if ( 0 != top && m_mesh_ci.m_index < top->m_tope.Count())
      {
        const ON_MeshTopologyEdge& e = top->m_tope[m_mesh_ci.m_index];
        for ( unsigned int j = 0; j < 2; j++ )
        {
          if ( e.m_topvi[j] >= 0 && e.m_topvi[j] < top->m_topv.Count() )
          {
            const ON_MeshTopologyVertex& v = top->m_topv[e.m_topvi[j]];
            if ( v.m_v_count > 0 && 0 != v.m_vi && v.m_vi[0] >= 0 )
            {
              vdex_buffer[vdex_count++] = (unsigned int)v.m_vi[0];
            }
          }
        }
      }
    }
    break;

  case ON_COMPONENT_INDEX::mesh_face:
    if (m_mesh_ci.m_index >= 0 && m_mesh_ci.m_index < m_mesh->m_F.Count())
    {
      vdex_list = (const unsigned int*)(m_mesh->m_F[m_mesh_ci.m_index].vi);
      vdex_count = (vdex_list[2] == vdex_list[3]) ? 3 : 4;
    }
    break;

  case ON_COMPONENT_INDEX::mesh_ngon:
    {
      const ON_MeshNgon* ngon = m_mesh->Ngon(m_mesh_ci.m_index);
      if ( ngon && ngon->m_Vcount > 0 && 0 != ngon->m_vi )
      {
        vdex_list = ngon->m_vi;
        vdex_count = ngon->m_Vcount;
      }
    }
    break;

  default:
    break;
  }

  if ( 0 == vdex_list )
  {
    if ( 0 == vdex_count )
      return 0;
    vdex_list = vdex_buffer;
  }

  bool rc = false;
  const ON_3dPointListRef vertex_list(m_mesh);
  const unsigned int vertex_count = vertex_list.PointCount();
  ON_3dPoint v[16];
  const unsigned int v_capacity = (unsigned int)(sizeof(v)/sizeof(v[0]));
  unsigned int v_count = 0;
  for ( unsigned int i = 0; i < vdex_count; i++ )
  {
    if ( vdex_list[i] < vertex_count )
    {
      vertex_list.GetPoint(vdex_list[i],&v[v_count].x);
      if ( v[v_count].IsValid() )
      {
        v_count++;
        if ( v_capacity == v_count )
        {
          if ( ON_GetPointListBoundingBox( 3, 0, v_count, 3, &v[0].x, boxmin, boxmax, bGrowBox?true:false ) )
          {
            bGrowBox = true;
            rc = true;
          }
          v_count = 0;
        }
      }
    }
  }

  if ( v_count > 0 )
  {
    if ( ON_GetPointListBoundingBox( 3, 0, v_count, 3, &v[0].x, boxmin, boxmax, bGrowBox?true:false ) )
      rc = true;
    v_count = 0;
  }

  return rc;
}